

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

void __thiscall runtime::VirtualMachine::Invoke(VirtualMachine *this)

{
  element_type *peVar1;
  anon_union_8_6_52c89740_for_Variable_1 aVar2;
  undefined4 uVar3;
  size_t __n;
  reference pvVar4;
  reference pvVar5;
  ulong __n_00;
  ulong uVar6;
  ulong __n_01;
  bool bVar7;
  Variable VVar8;
  string local_78;
  undefined1 auStack_58 [8];
  vector<runtime::Variable,_std::allocator<runtime::Variable>_> args;
  allocator<char> local_31;
  
  __n = getByteCodeParameter(this);
  auStack_58 = (undefined1  [8])0x0;
  args.super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  args.super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<runtime::Variable,_std::allocator<runtime::Variable>_>::reserve
            ((vector<runtime::Variable,_std::allocator<runtime::Variable>_> *)auStack_58,__n);
  if ((this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != (element_type *)0x0) {
    while (bVar7 = __n != 0, __n = __n - 1, bVar7) {
      VVar8 = popOpStack(this);
      local_78._M_string_length = (size_type)VVar8.field_1;
      local_78._M_dataplus._M_p._0_4_ = VVar8.type;
      std::vector<runtime::Variable,_std::allocator<runtime::Variable>_>::
      emplace_back<runtime::Variable>
                ((vector<runtime::Variable,_std::allocator<runtime::Variable>_> *)auStack_58,
                 (Variable *)&local_78);
    }
    VVar8 = popOpStack(this);
    if (VVar8.type == Function) {
      pushStackFrame(this,VVar8.field_1.functionValue);
      uVar6 = (long)args.super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>.
                    _M_impl.super__Vector_impl_data._M_start - (long)auStack_58 >> 4;
      __n_01 = uVar6;
      for (__n_00 = 0;
          (__n_01 = __n_01 - 1, __n_00 != uVar6 &&
          (peVar1 = (this->stackFrame).
                    super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
          __n_00 < (ulong)((long)(peVar1->locals).
                                 super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(peVar1->locals).
                                 super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 4)));
          __n_00 = __n_00 + 1) {
        pvVar4 = std::vector<runtime::Variable,_std::allocator<runtime::Variable>_>::at
                           ((vector<runtime::Variable,_std::allocator<runtime::Variable>_> *)
                            auStack_58,__n_01);
        pvVar5 = std::vector<runtime::Variable,_std::allocator<runtime::Variable>_>::at
                           (&((this->stackFrame).
                              super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->locals,__n_00);
        uVar3 = *(undefined4 *)&pvVar4->field_0x4;
        aVar2 = pvVar4->field_1;
        pvVar5->type = pvVar4->type;
        *(undefined4 *)&pvVar5->field_0x4 = uVar3;
        pvVar5->field_1 = aVar2;
      }
    }
    else {
      pushUndefined(this);
      peVar1 = (this->stackFrame).
               super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      peVar1->programCounter = peVar1->programCounter + 1;
    }
    std::_Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>::~_Vector_base
              ((_Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_> *)auStack_58);
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"No stack frame found in Invoke",&local_31);
  panic(this,&local_78);
}

Assistant:

void runtime::VirtualMachine::Invoke() {

  std::size_t argCount = this->getByteCodeParameter();

  std::vector<runtime::Variable> args;
  args.reserve(argCount);

  if (this->stackFrame == nullptr) {
    this->panic("No stack frame found in Invoke");
    return;
  }

  // index 0 <- arg n
  // index 1 <- arg n - 1
  // index n - 1 <- arg 1
  // index n <- arg 0

  for (std::size_t i = 0; i < argCount; i++) {
    args.push_back(this->popOpStack());
  }

  Variable top = this->popOpStack();

  if (top.type != VariableType::Function) {
    this->pushUndefined();
    this->advance();
    return;
  }

  this->pushStackFrame(top.functionValue);

  for (
    std::size_t stackFrameLocalIndex = 0, i = args.size();
    i-- > 0 && stackFrameLocalIndex < this->stackFrame->locals.size();
    stackFrameLocalIndex++
  ) {
    this->stackFrame->locals.at(stackFrameLocalIndex) = args.at(i);
  }
}